

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2App.cpp
# Opt level: O0

params * ParseParams(params *__return_storage_ptr__,int Argc,cstr *Argv)

{
  bool bVar1;
  out_mode oVar2;
  action local_2a;
  action local_29;
  cstr *Argv_local;
  int Argc_local;
  
  idx2::params::params(__return_storage_ptr__);
  bVar1 = idx2::OptExists(Argc,Argv,"--encode");
  if (bVar1) {
    local_29 = Encode;
  }
  else {
    bVar1 = idx2::OptExists(Argc,Argv,"--decode");
    if (bVar1) {
      __return_storage_ptr__->Action = Decode;
      local_2a = Decode;
    }
    else {
      local_2a = __Invalid__;
    }
    local_29 = local_2a;
  }
  __return_storage_ptr__->Action = local_29;
  if (__return_storage_ptr__->Action != __Invalid__) {
    bVar1 = idx2::OptExists(Argc,Argv,"--pause");
    __return_storage_ptr__->Pause = bVar1;
    idx2::OptVal(Argc,Argv,"--out_dir",&__return_storage_ptr__->OutDir);
    idx2::OptVal(Argc,Argv,"--out_file",&__return_storage_ptr__->OutFile);
    bVar1 = idx2::OptExists(Argc,Argv,"--dry");
    oVar2 = RegularGridFile;
    if (bVar1) {
      oVar2 = NoOutput;
    }
    __return_storage_ptr__->OutMode = oVar2;
    if (__return_storage_ptr__->Action == Encode) {
      ParseEncodeOptions(Argc,Argv,__return_storage_ptr__);
    }
    else if (__return_storage_ptr__->Action == Decode) {
      ParseDecodeOptions(Argc,Argv,__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  fprintf(_stderr,
          "Provide either --encode or --decode\nExample 1: --encode /Users/abc/Miranda-Density-[384-384-256]-Float64.raw\nExample 2: --encode Miranda-Density-[384-384-256]-Float64.raw\nExample 3: --decode /Users/abc/Miranda/Density.idx2\nExample 4: --decode Miranda/Density.idx2\n"
         );
  exit(1);
}

Assistant:

params
ParseParams(int Argc, cstr* Argv)
{
  params P;

  P.Action = OptExists(Argc, Argv, "--encode")   ? action::Encode
             : OptExists(Argc, Argv, "--decode") ? P.Action = action::Decode
                                                 : action::__Invalid__;

  idx2_ExitIf(P.Action == action::__Invalid__,
              "Provide either --encode or --decode\n"
              "Example 1: --encode /Users/abc/Miranda-Density-[384-384-256]-Float64.raw\n"
              "Example 2: --encode Miranda-Density-[384-384-256]-Float64.raw\n"
              "Example 3: --decode /Users/abc/Miranda/Density.idx2\n"
              "Example 4: --decode Miranda/Density.idx2\n");

  //// Parse the input file (--input)
  //idx2_ExitIf(!OptVal(Argc, Argv, "--input", &P.InputFile),
  //            "Provide --input\n"
  //            "Example: --input /Users/abc/MIRANDA-DENSITY-[384-384-256]-Float64.raw\n");

  // Parse the pause option (--pause): wait for keyboard input at the end
  P.Pause = OptExists(Argc, Argv, "--pause");

  // Parse the optional output directory (--out_dir)
  OptVal(Argc, Argv, "--out_dir", &P.OutDir);
  // Parse the optional output file (--out_file)
  OptVal(Argc, Argv, "--out_file", &P.OutFile);

  // Parse the dry run option (--dry): if enabled, skip writing the output file
  P.OutMode =
    OptExists(Argc, Argv, "--dry") ? params::out_mode::NoOutput : params::out_mode::RegularGridFile;

  // Perform parsing depending on the action
  if (P.Action == action::Encode)
    ParseEncodeOptions(Argc, Argv, &P);
  else if (P.Action == action::Decode)
    ParseDecodeOptions(Argc, Argv, &P);

  return P;
}